

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node>::clear
          (Data<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *this)

{
  Span *pSVar1;
  long lVar2;
  long lVar3;
  
  pSVar1 = this->spans;
  if (pSVar1 != (Span *)0x0) {
    lVar2 = *(long *)&pSVar1[-1].allocated;
    if (lVar2 != 0) {
      lVar3 = lVar2 * 0x90;
      do {
        Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node>::freeData
                  ((Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *)
                   (pSVar1[-1].offsets + lVar3));
        lVar3 = lVar3 + -0x90;
      } while (lVar3 != 0);
    }
    operator_delete__(&pSVar1[-1].allocated,lVar2 * 0x90 + 8);
  }
  this->spans = (Span *)0x0;
  this->size = 0;
  this->numBuckets = 0;
  return;
}

Assistant:

void clear()
    {
        delete[] spans;
        spans = nullptr;
        size = 0;
        numBuckets = 0;
    }